

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vbios_mgmt.c
# Opt level: O1

int vbios_upload_pramin(int cnum,uint8_t *vbios,int length)

{
  void *pvVar1;
  int iVar2;
  ulong uVar3;
  char cVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  undefined4 uVar8;
  
  iVar2 = -6;
  if (3 < (nva_cards[cnum]->chipset).chipset) {
    uVar8 = 0;
    fprintf(_stderr,"Attempt to upload the vbios to card %i (nv%02x) using PRAMIN\n",
            (ulong)(uint)cnum);
    cVar4 = '\0';
    vbios[length - 1U] = '\0';
    if (length != 0) {
      uVar6 = 1;
      cVar4 = '\0';
      do {
        cVar4 = cVar4 + vbios[uVar6 - 1 & 0xffff];
        uVar7 = uVar6 & 0xffff;
        uVar6 = uVar6 + 1;
      } while (uVar7 < (uint)length);
    }
    vbios[length - 1U] = -cVar4;
    if (0x4f < (nva_cards[cnum]->chipset).card_type) {
      pvVar1 = nva_cards[cnum]->bar0;
      uVar6 = *(uint *)((long)pvVar1 + 0x619f04) & 0xffff00;
      uVar7 = uVar6 << 8;
      if (uVar6 == 0) {
        uVar7 = *(int *)((long)pvVar1 + 0x1700) * 0x10000 + 0xf0000;
      }
      uVar8 = *(undefined4 *)((long)pvVar1 + 0x1700);
      *(uint *)((long)pvVar1 + 0x1700) = uVar7 >> 0x10;
    }
    if (0 < length) {
      uVar3 = 0x10000;
      if (length < 0x10000) {
        uVar3 = (ulong)(uint)length;
      }
      uVar5 = 0;
      do {
        *(uint8_t *)((long)nva_cards[cnum]->bar0 + uVar5 + 0x700000) = vbios[uVar5];
        uVar5 = uVar5 + 1;
      } while (uVar3 != uVar5);
    }
    iVar2 = 1;
    if (0x4f < (nva_cards[cnum]->chipset).card_type) {
      *(undefined4 *)((long)nva_cards[cnum]->bar0 + 0x1700) = uVar8;
    }
  }
  return iVar2;
}

Assistant:

int vbios_upload_pramin(int cnum, uint8_t *vbios, int length)
{
	uint32_t old_bar0_pramin = 0;
	int i = 0;

	if (nva_cards[cnum]->chipset.chipset < 0x04) {
		return ECARD;
	}

	fprintf(stderr, "Attempt to upload the vbios to card %i (nv%02x) using PRAMIN\n",
			cnum, nva_cards[cnum]->chipset.chipset);

	/* Update the checksum */
	chksum(vbios, length);

	if (nva_cards[cnum]->chipset.card_type >= 0x50) {
		uint32_t vbios_vram = (nva_rd32(cnum, 0x619f04) & ~0xff) << 8;

		if (!vbios_vram)
			vbios_vram = (nva_rd32(cnum, 0x1700) << 16) + 0xf0000;

		old_bar0_pramin = nva_rd32(cnum, 0x1700);
		nva_wr32(cnum, 0x1700, vbios_vram >> 16);
	}

	length = length < NV_PROM_SIZE ? length : NV_PROM_SIZE;

	for (i = 0; i < length; i++)
		nva_wr8(cnum, NV_PRAMIN_OFFSET + i, vbios[i]);

	if (nva_cards[cnum]->chipset.card_type >= 0x50)
		nva_wr32(cnum, 0x1700, old_bar0_pramin);

	return EOK;
}